

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACTable.cpp
# Opt level: O2

bool __thiscall FDInfo::UpdateFrom(FDInfo *this,LTFlightData *fd)

{
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_39UL>
  *this_00;
  double dVar1;
  uint uVar2;
  int iVar3;
  LTAircraft *this_01;
  positionTy *from;
  double dVar4;
  bool bVar5;
  FDKeyTy *pFVar6;
  long lVar7;
  float fVar8;
  char s [50];
  positionTy local_288;
  FDDynamicData dyn;
  string local_1f8 [32];
  vectorTy vecCam;
  FDStaticData stat;
  
  this->bUpToDate = true;
  pFVar6 = LTFlightData::FDKeyTy::operator=(&this->key,&fd->acKey);
  std::__cxx11::string::string((string *)&stat,(string *)&pFVar6->key);
  this_00 = &this->v;
  std::__cxx11::string::operator=((string *)this_00,(string *)&stat);
  std::__cxx11::string::~string((string *)&stat);
  LTFlightData::FDKeyTy::GetKeyTypeText(&this->key);
  std::__cxx11::string::assign((char *)((this->v)._M_elems + 1));
  stat.reg._M_dataplus._M_p = (pointer)&stat.reg.field_2;
  stat.reg._M_string_length = 0;
  stat.reg.field_2._M_local_buf[0] = '\0';
  stat.country._M_dataplus._M_p = (pointer)&stat.country.field_2;
  stat.country._M_string_length = 0;
  stat.country.field_2._M_local_buf[0] = '\0';
  stat.acTypeIcao._M_dataplus._M_p = (pointer)&stat.acTypeIcao.field_2;
  stat.acTypeIcao._M_string_length = 0;
  stat.acTypeIcao.field_2._M_local_buf[0] = '\0';
  stat.man._M_dataplus._M_p = (pointer)&stat.man.field_2;
  stat.man._M_string_length = 0;
  stat.man.field_2._M_local_buf[0] = '\0';
  stat.mdl._M_dataplus._M_p = (pointer)&stat.mdl.field_2;
  stat.mdl._M_string_length = 0;
  stat.mdl.field_2._M_local_buf[0] = '\0';
  stat.catDescr._M_dataplus._M_p = (pointer)&stat.catDescr.field_2;
  stat.catDescr._M_string_length = 0;
  stat.catDescr.field_2._M_local_buf[0] = '\0';
  stat.engType = -1;
  stat.engMount = -1;
  stat.year = 0;
  stat.mil = false;
  stat.pDoc8643 = (Doc8643 *)0x0;
  stat.call._M_dataplus._M_p = (pointer)&stat.call.field_2;
  stat.call._M_string_length = 0;
  stat.call.field_2._M_local_buf[0] = '\0';
  stat.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  stat.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  stat.stops.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stat.flight._M_dataplus._M_p = (pointer)&stat.flight.field_2;
  stat.flight._M_string_length = 0;
  stat.flight.field_2._M_local_buf[0] = '\0';
  stat.slug._M_dataplus._M_p = (pointer)&stat.slug.field_2;
  stat.slug._M_string_length = 0;
  stat.slug.field_2._M_local_buf[0] = '\0';
  stat.op._M_dataplus._M_p = (pointer)&stat.op.field_2;
  stat.op._M_string_length = 0;
  stat.op.field_2._M_local_buf[0] = '\0';
  stat.opIcao._M_dataplus._M_p = (pointer)&stat.opIcao.field_2;
  stat.opIcao._M_string_length = 0;
  stat.opIcao.field_2._M_local_buf[0] = '\0';
  stat.bDataMaster = false;
  stat.bDataRoute = false;
  bVar5 = LTFlightData::TryGetSafeCopy(fd,&stat);
  if (bVar5) {
    std::__cxx11::string::string(local_1f8,(string *)this_00);
    LTFlightData::FDStaticData::acId((string *)&dyn,&stat,(string)s._0_32_);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 2),(string *)&dyn);
    std::__cxx11::string::~string((string *)&dyn);
    std::__cxx11::string::~string(local_1f8);
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 3));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 4));
    Doc8643::get(&stat.acTypeIcao);
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 5));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 6));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 7));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 8));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 9));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 10));
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0xc));
    LTFlightData::FDStaticData::route_abi_cxx11_((string *)&dyn,&stat);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xd),(string *)&dyn);
    std::__cxx11::string::~string((string *)&dyn);
  }
  else {
    this->bUpToDate = false;
  }
  LTFlightData::FDDynamicData::FDDynamicData(&dyn);
  bVar5 = LTFlightData::TryGetSafeCopy(fd,&dyn);
  if (bVar5) {
    std::__cxx11::to_string((string *)&local_288,dyn.radar.code);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xb),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    if (dyn.pChannel == (LTChannel *)0x0) {
      (this->v)._M_elems[0x1f]._M_string_length = 0;
      *(this->v)._M_elems[0x1f]._M_dataplus._M_p = '\0';
      (this->v)._M_elems[0x1e]._M_string_length = 0;
      *(this->v)._M_elems[0x1e]._M_dataplus._M_p = '\0';
      (this->vf)._M_elems[0x1e] = NAN;
    }
    else {
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1f));
      fVar8 = (float)(fd->youngestTS - dataRefs.lastSimTime);
      (this->vf)._M_elems[0x1e] = fVar8;
      snprintf(s,0x32,"%+.f",SUB84((double)fVar8,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1e));
    }
  }
  else {
    this->bUpToDate = false;
  }
  this_01 = fd->pAc;
  if (this_01 == (LTAircraft *)0x0) {
    if ((this->v)._M_elems[0xf]._M_string_length != 0) {
      for (lVar7 = 0; lVar7 != 0x54; lVar7 = lVar7 + 4) {
        uVar2 = *(uint *)((long)&DAT_002105c0 + lVar7);
        (this->vf)._M_elems[uVar2] = NAN;
        (this->v)._M_elems[uVar2]._M_string_length = 0;
        *this_00->_M_elems[uVar2]._M_dataplus._M_p = '\0';
      }
    }
    from = (fd->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
           super__Deque_impl_data._M_start._M_cur;
    if ((fd->posDeque).super__Deque_base<positionTy,_std::allocator<positionTy>_>._M_impl.
        super__Deque_impl_data._M_finish._M_cur != from) {
      dVar1 = from->_lat;
      (this->vf)._M_elems[0x10] = (float)dVar1;
      snprintf(s,0x32,"%.4f",SUB84((double)(float)dVar1,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x10));
      dVar1 = from->_lon;
      (this->vf)._M_elems[0x11] = (float)dVar1;
      snprintf(s,0x32,"%.4f",SUB84((double)(float)dVar1,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x11));
      fVar8 = (float)(from->_alt / 0.3048);
      (this->vf)._M_elems[0x12] = fVar8;
      snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x12));
      DataRefs::GetViewPos();
      CoordVectorBetween(&vecCam,from,&local_288);
      (this->vf)._M_elems[0x1b] = (float)vecCam.angle;
      snprintf(s,0x32,"%.f",SUB84((double)(float)vecCam.angle,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1b));
      (this->vf)._M_elems[0x1c] = (float)(vecCam.dist / 1852.0);
      snprintf(s,0x32,"%.1f",SUB84((double)(float)(vecCam.dist / 1852.0),0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1c));
      if (!NAN(from->_head)) {
        fVar8 = (float)from->_head;
        (this->vf)._M_elems[0x18] = fVar8;
        snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
        std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x18));
      }
    }
    if (!NAN(dyn.spd)) {
      (this->vf)._M_elems[0x16] = (float)dyn.spd;
      snprintf(s,0x32,"%.f",SUB84((double)(float)dyn.spd,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x16));
    }
    if (!NAN(dyn.vsi)) {
      (this->vf)._M_elems[0x15] = (float)dyn.vsi;
      snprintf(s,0x32,"%.f",SUB84((double)(float)dyn.vsi,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x15));
    }
  }
  else {
    LTAircraft::RelativePositionText_abi_cxx11_((string *)&local_288,this_01);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0xf),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    fVar8 = (float)(this_01->ppos)._lat;
    (this->vf)._M_elems[0x10] = fVar8;
    snprintf(s,0x32,"%.4f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x10));
    fVar8 = (float)(this_01->ppos)._lon;
    (this->vf)._M_elems[0x11] = fVar8;
    snprintf(s,0x32,"%.4f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x11));
    fVar8 = (float)((this_01->ppos)._alt / 0.3048);
    (this->vf)._M_elems[0x12] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x12));
    fVar8 = (float)(((this_01->ppos)._alt - this_01->terrainAlt_m) / 0.3048);
    (this->vf)._M_elems[0x13] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x13));
    dVar1 = this_01->vsi;
    (this->vf)._M_elems[0x15] = (float)dVar1;
    snprintf(s,0x32,"%.f",SUB84((double)(float)dVar1,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x15));
    dVar4 = (double)(this->vf)._M_elems[0x15];
    dVar1 = this_01->pMdl->VSI_STABLE;
    if ((dVar4 < -dVar1) || (dVar1 < dVar4)) {
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x14));
    }
    else {
      (this->v)._M_elems[0x14]._M_string_length = 0;
      *(this->v)._M_elems[0x14]._M_dataplus._M_p = '\0';
    }
    fVar8 = (float)(this_01->speed).currSpeed_kt;
    (this->vf)._M_elems[0x16] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x16));
    fVar8 = (float)(this_01->vec).angle;
    (this->vf)._M_elems[0x17] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x17));
    fVar8 = (float)((this_01->ppos)._head + (this_01->corrAngle).val);
    (this->vf)._M_elems[0x18] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x18));
    fVar8 = (float)(this_01->ppos)._pitch;
    (this->vf)._M_elems[0x19] = fVar8;
    snprintf(s,0x32,"%.1f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x19));
    fVar8 = (float)(this_01->ppos)._roll;
    (this->vf)._M_elems[0x1a] = fVar8;
    snprintf(s,0x32,"%.1f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1a));
    fVar8 = (this_01->super_Aircraft).camBearing;
    (this->vf)._M_elems[0x1b] = fVar8;
    snprintf(s,0x32,"%.f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1b));
    fVar8 = (this_01->super_Aircraft).camDist / 1852.0;
    (this->vf)._M_elems[0x1c] = fVar8;
    snprintf(s,0x32,"%.1f",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x1c));
    XPMP2::Aircraft::GetModelName_abi_cxx11_(&this_01->super_Aircraft);
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0x1d));
    LTAircraft::GetFlightPhaseRwyString_abi_cxx11_((string *)&local_288,this_01);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0x20),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    (this->vf)._M_elems[0x20] = (float)this_01->phase;
    fVar8 = (float)((this_01->gear).val * 100.0);
    (this->vf)._M_elems[0x21] = fVar8;
    snprintf(s,0x32,"%.f%%",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x21));
    fVar8 = (float)((this_01->flaps).val * 100.0);
    (this->vf)._M_elems[0x22] = fVar8;
    snprintf(s,0x32,"%.f%%",SUB84((double)fVar8,0));
    std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x22));
    LTAircraft::GetLightsStr_abi_cxx11_((string *)&local_288,this_01);
    std::__cxx11::string::operator=((string *)((this->v)._M_elems + 0x23),(string *)&local_288);
    std::__cxx11::string::~string((string *)&local_288);
    iVar3 = (this_01->super_Aircraft).tcasTargetIdx;
    if (iVar3 < 1) {
      (this->vf)._M_elems[0x24] = NAN;
      (this->v)._M_elems[0x24]._M_string_length = 0;
      *(this->v)._M_elems[0x24]._M_dataplus._M_p = '\0';
    }
    else {
      (this->vf)._M_elems[0x24] = (float)iVar3;
      snprintf(s,0x32,"%.f",SUB84((double)iVar3,0));
      std::__cxx11::string::assign((char *)((this->v)._M_elems + 0x24));
    }
    std::__cxx11::string::_M_assign((string *)((this->v)._M_elems + 0x25));
  }
  bVar5 = this->bUpToDate;
  LTFlightData::FDStaticData::~FDStaticData(&stat);
  return bVar5;
}

Assistant:

bool FDInfo::UpdateFrom (const LTFlightData& fd)
{
    // buffer and macro for converting numeric data
    char s[50];
#define v_f(idx,fmt,val) vf[idx] = float(val); snprintf(s, sizeof(s), fmt, vf[idx]); v[idx] = s;

    bUpToDate = true;
    v[ACT_COL_KEY] = key = fd.key();    // possible without lock
    v[ACT_COL_KEY_TYPE]  = key.GetKeyTypeText();

    // try fetching some static data
    LTFlightData::FDStaticData stat;
    if (fd.TryGetSafeCopy(stat)) {
        v[ACT_COL_ID]           = stat.acId(v[ACT_COL_KEY]);
        v[ACT_COL_REG]          = stat.reg;
        v[ACT_COL_TYPE]         = stat.acTypeIcao;
        v[ACT_COL_CLASS]        = Doc8643::get(stat.acTypeIcao).classification;
        v[ACT_COL_MAN]          = stat.man;
        v[ACT_COL_MDL]          = stat.mdl;
        v[ACT_COL_CAT_DESCR]    = stat.catDescr;
        v[ACT_COL_OP]           = stat.op;
        v[ACT_COL_CALLSIGN]     = stat.call;
        v[ACT_COL_FLIGHT]       = stat.flight;
        v[ACT_COL_ROUTE]        = stat.route();
    } else
        bUpToDate = false;
    
    // try fetching some dynamic data
    LTFlightData::FDDynamicData dyn;
    if (fd.TryGetSafeCopy(dyn)) {
        v[ACT_COL_SQUAWK]       = std::to_string(dyn.radar.code);
        if (dyn.pChannel) {
            v[ACT_COL_CHANNEL]  = dyn.pChannel->ChName();
            // last flight data / channel
            v_f(ACT_COL_LASTDATA, "%+.f", fd.GetYoungestTS() - dataRefs.GetSimTime());
        } else {
            v[ACT_COL_CHANNEL].clear();
            v[ACT_COL_LASTDATA].clear();
            vf[ACT_COL_LASTDATA] = NAN;
        }
    } else
        bUpToDate = false;
    
    
    // try fetching some actual flight data
    LTAircraft* pAc = fd.GetAircraft();
    if (pAc) {
        v[ACT_COL_POS]          = pAc->RelativePositionText();
        v_f(ACT_COL_LAT,    "%.4f",     pAc->GetPPos().lat());
        v_f(ACT_COL_LON,    "%.4f",     pAc->GetPPos().lon());
        v_f(ACT_COL_ALT,    "%.f",      pAc->GetAlt_ft());
        v_f(ACT_COL_AGL,    "%.f",      pAc->GetPHeight_ft());
        v_f(ACT_COL_VSI,    "%.f",      pAc->GetVSI_ft());
        if (vf[ACT_COL_VSI] < -pAc->pMdl->VSI_STABLE)     // up/down arrow depending on value of VSI
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_DOWN;
        else if (vf[ACT_COL_VSI] > pAc->pMdl->VSI_STABLE)
            v[ACT_COL_UPDOWN] = ICON_FA_CHEVRON_UP;
        else
            v[ACT_COL_UPDOWN].clear();
        v_f(ACT_COL_SPEED,  "%.f",      pAc->GetSpeed_kt());
        v_f(ACT_COL_TRACK,  "%.f",      pAc->GetTrack());
        v_f(ACT_COL_HEADING,"%.f",      pAc->GetHeading());
        v_f(ACT_COL_PITCH,  "%.1f",     pAc->GetPitch());
        v_f(ACT_COL_ROLL,   "%.1f",     pAc->GetRoll());
        v_f(ACT_COL_BEARING,"%.f",      pAc->GetCameraBearing());
        v_f(ACT_COL_DIST,   "%.1f",     pAc->GetCameraDist() / M_per_NM);
        
        v[ACT_COL_CSLMDL]       = pAc->GetModelName();
        v[ACT_COL_PHASE]        = pAc->GetFlightPhaseRwyString();
        vf[ACT_COL_PHASE]       = float(pAc->GetFlightPhase()); // sort flight phase by its index
        v_f(ACT_COL_GEAR,   "%.f%%",    pAc->GetGearPos() * 100.0);
        v_f(ACT_COL_FLAPS,  "%.f%%",    pAc->GetFlapsPos() * 100.0);
        v[ACT_COL_LIGHTS]       = pAc->GetLightsStr();
        if (pAc->IsCurrentlyShownAsTcasTarget()) {
            v_f(ACT_COL_TCAS_IDX, "%.f", pAc->GetTcasTargetIdx());
        } else {
            vf[ACT_COL_TCAS_IDX] = NAN;
            v[ACT_COL_TCAS_IDX].clear();
        }
        v[ACT_COL_FLIGHTMDL]    = pAc->pMdl->modelName;
            
    }
    else {
        // if there is no a/c, but there previously was, then we need to clear a lot of fields
        if (!v[ACT_COL_POS].empty()) {
            for (size_t idx: {
                ACT_COL_POS, ACT_COL_LAT, ACT_COL_LON, ACT_COL_ALT, ACT_COL_AGL,
                ACT_COL_VSI, ACT_COL_UPDOWN, ACT_COL_SPEED, ACT_COL_TRACK, ACT_COL_HEADING,
                ACT_COL_PITCH, ACT_COL_ROLL, ACT_COL_BEARING, ACT_COL_DIST,
                ACT_COL_CSLMDL, ACT_COL_PHASE, ACT_COL_GEAR, ACT_COL_FLAPS,
                ACT_COL_LIGHTS, ACT_COL_TCAS_IDX, ACT_COL_FLIGHTMDL
            })
            { vf[idx] = NAN; v[idx].clear(); }
        }
        
        // We can try finding some positional information in the pos deque
        const dequePositionTy& posDeque = fd.GetPosDeque();
        if (!posDeque.empty()) {
            const positionTy& firstPos = posDeque.front();
            v_f(ACT_COL_LAT,    "%.4f",     firstPos.lat());
            v_f(ACT_COL_LON,    "%.4f",     firstPos.lon());
            v_f(ACT_COL_ALT,    "%.f",      firstPos.alt_ft());
            const vectorTy vecCam = firstPos.between(dataRefs.GetViewPos());
            v_f(ACT_COL_BEARING,"%.f",      vecCam.angle);
            v_f(ACT_COL_DIST,   "%.1f",     vecCam.dist / M_per_NM);
            if (!std::isnan(firstPos.heading())) {
                v_f(ACT_COL_HEADING, "%.f", firstPos.heading());
            }
        }
        if (!std::isnan(dyn.spd)) {
            v_f(ACT_COL_SPEED,  "%.f",      dyn.spd);
        }
        if (!std::isnan(dyn.vsi)) {
            v_f(ACT_COL_VSI,    "%.f",      dyn.vsi);
        }
    }
    
    // Have we successfully updated?
    return bUpToDate;
}